

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> Arguments;
  ParseResult Result;
  Options Opts;
  int local_244;
  vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> local_240;
  string local_228;
  string local_208;
  ParseResult local_1e8;
  Options local_128;
  
  local_244 = argc;
  std::__cxx11::string::string((string *)&local_208,"ph-opt",(allocator *)&local_1e8);
  std::__cxx11::string::string
            ((string *)&local_228,"Phaeton optimizer command line options",(allocator *)&local_240);
  cxxopts::Options::Options(&local_128,&local_208,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  createOptions(&local_128);
  parseArgs(&local_1e8,&local_128,&local_244,argv);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::vector
            (&local_240,&local_1e8.m_sequential);
  buildJobs(&local_128,&local_1e8);
  std::vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>::~vector(&local_240);
  cxxopts::ParseResult::~ParseResult(&local_1e8);
  cxxopts::Options::~Options(&local_128);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  Options Opts(/*argv[0]*/ PH_OPTIMIZER_EXE,
               "Phaeton optimizer command line options");
  createOptions(Opts);
  // Parse input command line arguments.
  auto Result = parseArgs(Opts, argc, argv);
  auto Arguments = Result.arguments();

  buildJobs(Opts, Result);
  return 0;
}